

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# midi2notes.cpp
# Opt level: O0

void printLegend(MidiFile *midifile)

{
  int iVar1;
  ostream *poVar2;
  size_type sVar3;
  reference pvVar4;
  int local_18;
  int local_14;
  int i;
  int sum;
  MidiFile *midifile_local;
  
  std::operator<<((ostream *)&std::cout,"\n");
  std::operator<<((ostream *)&std::cout,
                  "%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%\n");
  std::operator<<((ostream *)&std::cout,
                  "%% DATA LEGEND                                               %%\n");
  std::operator<<((ostream *)&std::cout,
                  "%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%\n");
  switch(timetype) {
  case 1:
    std::operator<<((ostream *)&std::cout,"% time unit: ticks\n");
    break;
  case 2:
    std::operator<<((ostream *)&std::cout,"% time unit: beat\n");
    break;
  case 3:
    std::operator<<((ostream *)&std::cout,"% time unit: seconds\n");
    break;
  case 4:
    std::operator<<((ostream *)&std::cout,"% time unit: milliseconds\n");
    break;
  default:
    std::operator<<((ostream *)&std::cout,"% time unit: unknown\n");
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"% Ticks per quarter note: ");
  iVar1 = smf::MidiFile::getTicksPerQuarterNote(midifile);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
  std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<((ostream *)&std::cout,"% unused parameter marker: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,unused);
  std::operator<<(poVar2,"\n");
  local_14 = 0;
  for (local_18 = 0; sVar3 = std::vector<int,_std::allocator<int>_>::size(&legend_opcode),
      local_18 < (int)sVar3; local_18 = local_18 + 1) {
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&legend_opcode,(long)local_18);
    local_14 = *pvVar4 + local_14;
  }
  if (0 < local_14) {
    poVar2 = std::operator<<((ostream *)&std::cout,"% ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_14);
    std::operator<<(poVar2," opcodes are present in the data:\n");
    for (local_18 = 0; sVar3 = std::vector<int,_std::allocator<int>_>::size(&legend_opcode),
        local_18 < (int)sVar3; local_18 = local_18 + 1) {
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&legend_opcode,(long)local_18);
      if (*pvVar4 != 0) {
        iVar1 = local_18 * 1000;
        if (iVar1 == 1000) {
          poVar2 = std::operator<<((ostream *)&std::cout,"%\topcode ");
          poVar2 = (ostream *)std::ostream::operator<<(poVar2,1000);
          std::operator<<(poVar2,"\t= note\n");
          std::operator<<((ostream *)&std::cout,"%\t\tp1 = start time of note\n");
          std::operator<<((ostream *)&std::cout,"%\t\tp2 = opcode for note\n");
          std::operator<<((ostream *)&std::cout,"%\t\tp3 = duration of note\n");
          std::operator<<((ostream *)&std::cout,"%\t\tp4 = MIDI key number\n");
          std::operator<<((ostream *)&std::cout,"%\t\tp5 = MIDI attack velocity\n");
          std::operator<<((ostream *)&std::cout,"%\t\tp6 = MIDI channel\n");
          std::operator<<((ostream *)&std::cout,"%\t\tp7 = MIDI-file track number\n");
        }
        else if (iVar1 == 2000) {
          poVar2 = std::operator<<((ostream *)&std::cout,"%\topcode ");
          poVar2 = (ostream *)std::ostream::operator<<(poVar2,2000);
          std::operator<<(poVar2,"\t= continuous controller\n");
          std::operator<<((ostream *)&std::cout,"%\t\tp1 = action time of controller\n");
          std::operator<<((ostream *)&std::cout,"%\t\tp2 = opcode for controller\n");
          std::operator<<((ostream *)&std::cout,"%\t\tp3 = controller number\n");
          std::operator<<((ostream *)&std::cout,"%\t\tp4 = controller value\n");
          std::operator<<((ostream *)&std::cout,"%\t\tp5 = unused\n");
          std::operator<<((ostream *)&std::cout,"%\t\tp6 = MIDI channel\n");
          std::operator<<((ostream *)&std::cout,"%\t\tp7 = MIDI-file track number\n");
        }
        else if (iVar1 == 3000) {
          poVar2 = std::operator<<((ostream *)&std::cout,"%\topcode ");
          poVar2 = (ostream *)std::ostream::operator<<(poVar2,3000);
          std::operator<<(poVar2,"\t= instrument\n");
          std::operator<<((ostream *)&std::cout,"%\t\tp1 = start time of instrument on channel\n");
          std::operator<<((ostream *)&std::cout,"%\t\tp2 = opcode for instrument\n");
          std::operator<<((ostream *)&std::cout,"%\t\tp3 = instrument number\n");
          std::operator<<((ostream *)&std::cout,"%\t\tp4-p5 = unused\n");
          std::operator<<((ostream *)&std::cout,"%\t\tp6 = MIDI channel\n");
          std::operator<<((ostream *)&std::cout,"%\t\tp7 = MIDI-file track number\n");
        }
        else if (iVar1 == 4000) {
          poVar2 = std::operator<<((ostream *)&std::cout,"%\topcode ");
          poVar2 = (ostream *)std::ostream::operator<<(poVar2,4000);
          std::operator<<(poVar2,"\t= tempo change\n");
          std::operator<<((ostream *)&std::cout,"%\t\tp1 = start time of tempo\n");
          std::operator<<((ostream *)&std::cout,"%\t\tp2 = opcode for tempo\n");
          std::operator<<((ostream *)&std::cout,"%\t\tp3 = number of beats per minute\n");
          std::operator<<((ostream *)&std::cout,"%\t\tp4-p7 = unused\n");
        }
        else if (iVar1 == 5000) {
          poVar2 = std::operator<<((ostream *)&std::cout,"%\topcode ");
          poVar2 = (ostream *)std::ostream::operator<<(poVar2,5000);
          std::operator<<(poVar2,"\t= meter signature\n");
          std::operator<<((ostream *)&std::cout,"%\t\tp1 = start time of meter signature\n");
          std::operator<<((ostream *)&std::cout,"%\t\tp2 = opcode for meter\n");
          std::operator<<((ostream *)&std::cout,"%\t\tp3 = numerator of meter\n");
          std::operator<<((ostream *)&std::cout,"%\t\tp4 = denominator of meter\n");
          std::operator<<((ostream *)&std::cout,"%\t\tp5-p7 = unused\n");
        }
        else if (iVar1 == 6000) {
          poVar2 = std::operator<<((ostream *)&std::cout,"%\topcode ");
          poVar2 = (ostream *)std::ostream::operator<<(poVar2,6000);
          std::operator<<(poVar2,"\t= key signature\n");
          std::operator<<((ostream *)&std::cout,"%\t\tp1 = start time of key signature\n");
          std::operator<<((ostream *)&std::cout,"%\t\tp2 = opcode for key signature\n");
          std::operator<<((ostream *)&std::cout,
                          "%\t\tp3 = number of sharps (positive) or flats (negative)\n");
          std::operator<<((ostream *)&std::cout,"%\t\tp4 = mode (0=major, 1=minor)\n");
          std::operator<<((ostream *)&std::cout,"%\t\tp5-p7 = unused\n");
        }
        else {
          poVar2 = std::operator<<((ostream *)&std::cout,"%\topcode ");
          poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_18 * 1000);
          std::operator<<(poVar2,"\t= unknown\n");
        }
      }
    }
  }
  local_14 = 0;
  for (local_18 = 0; sVar3 = std::vector<int,_std::allocator<int>_>::size(&legend_instr),
      local_18 < (int)sVar3; local_18 = local_18 + 1) {
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&legend_instr,(long)local_18);
    local_14 = *pvVar4 + local_14;
  }
  if (0 < local_14) {
    poVar2 = std::operator<<((ostream *)&std::cout,"% ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_14);
    std::operator<<(poVar2," instrument timbres are present in the data:\n");
    for (local_18 = 0; sVar3 = std::vector<int,_std::allocator<int>_>::size(&legend_instr),
        local_18 < (int)sVar3; local_18 = local_18 + 1) {
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&legend_instr,(long)local_18);
      if (*pvVar4 != 0) {
        poVar2 = std::operator<<((ostream *)&std::cout,"%\tinstrument number ");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_18);
        poVar2 = std::operator<<(poVar2,"\t= ");
        poVar2 = std::operator<<(poVar2,GMinstrument[local_18]);
        std::operator<<(poVar2,"\n");
      }
    }
  }
  local_14 = 0;
  for (local_18 = 0; sVar3 = std::vector<int,_std::allocator<int>_>::size(&legend_controller),
      local_18 < (int)sVar3; local_18 = local_18 + 1) {
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&legend_controller,(long)local_18);
    local_14 = *pvVar4 + local_14;
  }
  if (0 < local_14) {
    poVar2 = std::operator<<((ostream *)&std::cout,"% ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_14);
    std::operator<<(poVar2," types of controllers are present in the data:\n");
    for (local_18 = 0; sVar3 = std::vector<int,_std::allocator<int>_>::size(&legend_controller),
        local_18 < (int)sVar3; local_18 = local_18 + 1) {
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&legend_controller,(long)local_18)
      ;
      if (*pvVar4 != 0) {
        poVar2 = std::operator<<((ostream *)&std::cout,"%\tcontroller ");
        poVar2 = std::operator<<(poVar2,GMcontrollers[local_18]);
        std::operator<<(poVar2,"\n");
      }
    }
  }
  std::operator<<((ostream *)&std::cout,
                  "%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%\n");
  return;
}

Assistant:

void printLegend(MidiFile& midifile) {
   int sum = 0;
   int i;

   cout << "\n";
   cout << "%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%\n";
   cout << "%% DATA LEGEND                                               %%\n";
   cout << "%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%\n";
   switch (timetype) {
      case TICK: cout << "% time unit: ticks\n";         break;
      case BEAT: cout << "% time unit: beat\n";          break;
      case SEC:  cout << "% time unit: seconds\n";       break;
      case MSEC: cout << "% time unit: milliseconds\n";  break;
      default:   cout << "% time unit: unknown\n";

   }
   cout << "% Ticks per quarter note: " << midifile.getTicksPerQuarterNote()
        << "\n";
   cout << "% unused parameter marker: " << unused << "\n";
   // check for opcodes used in data:
   sum = 0;
   for (i=0; i<(int)legend_opcode.size(); i++) {
      sum += legend_opcode[i];
   }
   if (sum > 0) {
      cout << "% " << sum << " opcodes are present in the data:\n";
      for (i=0; i<(int)legend_opcode.size(); i++) {
         if (legend_opcode[i]) {
            switch (i*1000) {
               case OP_NOTE:
                  cout << "%\topcode " << OP_NOTE << "\t= note\n";
                  cout << "%\t\tp1 = start time of note\n";
                  cout << "%\t\tp2 = opcode for note\n";
                  cout << "%\t\tp3 = duration of note\n";
                  cout << "%\t\tp4 = MIDI key number\n";
                  cout << "%\t\tp5 = MIDI attack velocity\n";
                  cout << "%\t\tp6 = MIDI channel\n";
                  cout << "%\t\tp7 = MIDI-file track number\n";
                  break;
               case OP_TEMPO:
                  cout << "%\topcode " << OP_TEMPO << "\t= tempo change\n";
                  cout << "%\t\tp1 = start time of tempo\n";
                  cout << "%\t\tp2 = opcode for tempo\n";
                  cout << "%\t\tp3 = number of beats per minute\n";
                  cout << "%\t\tp4-p7 = unused\n";
                  break;
               case OP_CONTROL:
                  cout << "%\topcode " << OP_CONTROL
                       << "\t= continuous controller\n";
                  cout << "%\t\tp1 = action time of controller\n";
                  cout << "%\t\tp2 = opcode for controller\n";
                  cout << "%\t\tp3 = controller number\n";
                  cout << "%\t\tp4 = controller value\n";
                  cout << "%\t\tp5 = unused\n";
                  cout << "%\t\tp6 = MIDI channel\n";
                  cout << "%\t\tp7 = MIDI-file track number\n";
                  break;
               case OP_INSTR:
                  cout << "%\topcode " << OP_INSTR << "\t= instrument\n";
                  cout << "%\t\tp1 = start time of instrument on channel\n";
                  cout << "%\t\tp2 = opcode for instrument\n";
                  cout << "%\t\tp3 = instrument number\n";
                  cout << "%\t\tp4-p5 = unused\n";
                  cout << "%\t\tp6 = MIDI channel\n";
                  cout << "%\t\tp7 = MIDI-file track number\n";
                  break;
               case OP_METER:
                  cout << "%\topcode " << OP_METER << "\t= meter signature\n";
                  cout << "%\t\tp1 = start time of meter signature\n";
                  cout << "%\t\tp2 = opcode for meter\n";
                  cout << "%\t\tp3 = numerator of meter\n";
                  cout << "%\t\tp4 = denominator of meter\n";
                  cout << "%\t\tp5-p7 = unused\n";
                  break;
               case OP_KEYSIG:
                  cout << "%\topcode " << OP_KEYSIG << "\t= key signature\n";
                  cout << "%\t\tp1 = start time of key signature\n";
                  cout << "%\t\tp2 = opcode for key signature\n";
                  cout << "%\t\tp3 = number of sharps (positive) or flats (negative)\n";
                  cout << "%\t\tp4 = mode (0=major, 1=minor)\n";
                  cout << "%\t\tp5-p7 = unused\n";
                  break;
               default:
                  cout << "%\topcode " << i*1000 << "\t= unknown\n";
            }
         }
      }
   }


   // check for instruments to list:
   sum = 0;
   for (i=0; i<(int)legend_instr.size(); i++) {
      sum += legend_instr[i];
   }
   if (sum > 0) {
      cout << "% " << sum << " instrument timbres are present in the data:\n";
      for (i=0; i<(int)legend_instr.size(); i++) {
         if (legend_instr[i]) {
            cout << "%\tinstrument number " << i << "\t= "
                 << GMinstrument[i] << "\n";
         }
      }
   }

   // check for controllers to list:
   sum = 0;
   for (i=0; i<(int)legend_controller.size(); i++) {
      sum += legend_controller[i];
   }
   if (sum > 0) {
      cout << "% " << sum << " types of controllers are present in the data:\n";
      for (i=0; i<(int)legend_controller.size(); i++) {
         if (legend_controller[i]) {
            cout << "%\tcontroller " << GMcontrollers[i] << "\n";
         }
      }
   }

   cout << "%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%\n";

}